

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<unsigned_char>::vector(vector<unsigned_char> *this,vector<unsigned_char> *other)

{
  vector<unsigned_char> *other_local;
  vector<unsigned_char> *this_local;
  
  this->m_p = (uchar *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  increase_capacity(this,other->m_size,false,false);
  this->m_size = other->m_size;
  memcpy(this->m_p,other->m_p,(ulong)this->m_size);
  return;
}

Assistant:

inline vector(const vector& other):
            m_p(nullptr),
            m_size(0),
            m_capacity(0)
        {
            increase_capacity(other.m_size, false);

            m_size = other.m_size;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }
        }